

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-barrier.c
# Opt level: O2

int run_test_barrier_1(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_50;
  uv_thread_t thread;
  worker_config wc;
  
  wc.delay = 0;
  wc.posted = 0;
  wc.main_barrier_wait_rval = 0;
  wc.worker_barrier_wait_rval = 0;
  wc.barrier._16_8_ = 0;
  wc.barrier._24_8_ = 0;
  wc.barrier.__align = 0;
  wc.barrier._8_8_ = 0;
  iVar1 = uv_barrier_init(&wc,2);
  if (iVar1 == 0) {
    iVar1 = uv_thread_create(&thread,worker,&wc);
    if (iVar1 == 0) {
      uv_sleep(100);
      wc.main_barrier_wait_rval = uv_barrier_wait(&wc);
      iVar1 = uv_thread_join(&thread);
      if (iVar1 == 0) {
        uv_barrier_destroy(&wc);
        if ((wc.worker_barrier_wait_rval ^ wc.main_barrier_wait_rval) == 1) {
          return 0;
        }
        pcVar2 = "1 == (wc.main_barrier_wait_rval ^ wc.worker_barrier_wait_rval)";
        uStack_50 = 0x3e;
      }
      else {
        pcVar2 = "0 == uv_thread_join(&thread)";
        uStack_50 = 0x3b;
      }
    }
    else {
      pcVar2 = "0 == uv_thread_create(&thread, worker, &wc)";
      uStack_50 = 0x36;
    }
  }
  else {
    pcVar2 = "0 == uv_barrier_init(&wc.barrier, 2)";
    uStack_50 = 0x35;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-barrier.c"
          ,uStack_50,pcVar2);
  abort();
}

Assistant:

TEST_IMPL(barrier_1) {
  uv_thread_t thread;
  worker_config wc;

  memset(&wc, 0, sizeof(wc));

  ASSERT(0 == uv_barrier_init(&wc.barrier, 2));
  ASSERT(0 == uv_thread_create(&thread, worker, &wc));

  uv_sleep(100);
  wc.main_barrier_wait_rval = uv_barrier_wait(&wc.barrier);

  ASSERT(0 == uv_thread_join(&thread));
  uv_barrier_destroy(&wc.barrier);

  ASSERT(1 == (wc.main_barrier_wait_rval ^ wc.worker_barrier_wait_rval));

  return 0;
}